

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNdr.c
# Opt level: O1

void Ndr_NtkPrintNodes(Wlc_Ntk_t *pNtk)

{
  Wlc_Obj_t *pWVar1;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  
  puts("Node IDs and their fanins:");
  if (1 < pNtk->iObj) {
    uVar5 = 1;
    do {
      if ((long)pNtk->nObjsAlloc <= (long)uVar5) {
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      pWVar1 = pNtk->pObjs + uVar5;
      if ((pWVar1->nFanins < 3) &&
         ((undefined1  [24])((undefined1  [24])*pWVar1 & (undefined1  [24])0x2f) !=
          (undefined1  [24])0x6)) {
        paVar2 = &pWVar1->field_10;
      }
      else {
        paVar2 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pWVar1->field_10).pFanins[0];
      }
      lVar4 = 0;
      printf("%5d = ",uVar5 & 0xffffffff);
      if (0 < (int)pWVar1->nFanins) {
        lVar4 = 0;
        do {
          printf("%5d ",(ulong)(uint)paVar2->Fanins[lVar4]);
          lVar4 = lVar4 + 1;
        } while (lVar4 < (int)pWVar1->nFanins);
      }
      if ((uint)lVar4 < 4) {
        iVar3 = (uint)lVar4 - 4;
        do {
          printf("      ");
          iVar3 = iVar3 + 1;
        } while (iVar3 != 0);
      }
      if ((long)(pNtk->vNameIds).nSize <= (long)uVar5) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      printf("    Name Id %d ",(ulong)(uint)(pNtk->vNameIds).pArray[uVar5]);
      if ((undefined1  [24])((undefined1  [24])*pWVar1 & (undefined1  [24])0x3f) ==
          (undefined1  [24])0x1) {
        printf("  pi  ");
      }
      if ((pWVar1->field_0x1 & 2) != 0) {
        printf("  po  ");
      }
      putchar(10);
      uVar5 = uVar5 + 1;
    } while ((long)uVar5 < (long)pNtk->iObj);
  }
  return;
}

Assistant:

void Ndr_NtkPrintNodes( Wlc_Ntk_t * pNtk )
{
    Wlc_Obj_t * pObj; int i, k;
    printf( "Node IDs and their fanins:\n" );
    Wlc_NtkForEachObj( pNtk, pObj, i )
    {
        int * pFanins = Wlc_ObjFanins(pObj);
        printf( "%5d = ", i );
        for ( k = 0; k < Wlc_ObjFaninNum(pObj); k++ )
            printf( "%5d ", pFanins[k] );
        for (      ; k < 4; k++ )
            printf( "      " );
        printf( "    Name Id %d ", Wlc_ObjNameId(pNtk, i) );
        if ( Wlc_ObjIsPi(pObj) )
            printf( "  pi  " );
        if ( Wlc_ObjIsPo(pObj) )
            printf( "  po  " );
        printf( "\n" );
    }
}